

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O1

void deqp::gles3::Functional::eval_refract_vec4(ShaderEvalContext *c)

{
  float fVar1;
  int i;
  long lVar2;
  float fVar3;
  float res;
  float fVar4;
  Vector<float,_4> res_3;
  Vector<float,_4> res_2;
  Vector<float,_4> res_1;
  float local_58 [4];
  undefined8 local_48;
  float local_40;
  float local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  float local_28 [8];
  
  local_48 = *(undefined8 *)(c->in[0].m_data + 1);
  local_40 = c->in[0].m_data[3];
  local_3c = c->in[0].m_data[0];
  local_58[0] = c->in[1].m_data[3];
  local_58[1] = c->in[1].m_data[2];
  local_58[2] = c->in[1].m_data[1];
  local_58[3] = c->in[1].m_data[0];
  fVar1 = c->in[2].m_data[1];
  fVar4 = 0.0;
  lVar2 = 0;
  do {
    fVar4 = fVar4 + local_58[lVar2] * *(float *)((long)&local_48 + lVar2 * 4);
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  fVar3 = 1.0 - fVar1 * fVar1 * (1.0 - fVar4 * fVar4);
  if (0.0 <= fVar3) {
    local_28[4] = 0.0;
    local_28[5] = 0.0;
    local_28[6] = 0.0;
    local_28[7] = 0.0;
    lVar2 = 0;
    do {
      local_28[lVar2 + 4] = *(float *)((long)&local_48 + lVar2 * 4) * fVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    local_28[2] = 0.0;
    local_28[3] = 0.0;
    lVar2 = 0;
    do {
      local_28[lVar2] = local_58[lVar2] * (fVar1 * fVar4 + fVar3);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    local_38 = 0;
    uStack_30 = 0;
    lVar2 = 0;
    do {
      *(float *)((long)&local_38 + lVar2 * 4) = local_28[lVar2 + 4] - local_28[lVar2];
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
  }
  else {
    local_38 = 0;
    uStack_30 = 0;
  }
  *(undefined8 *)(c->color).m_data = local_38;
  *(undefined8 *)((c->color).m_data + 2) = uStack_30;
  return;
}

Assistant:

void eval_refract_vec4	(ShaderEvalContext& c) { c.color		= refract(c.in[0].swizzle(1, 2, 3, 0), c.in[1].swizzle(3, 2, 1, 0), c.in[2].y()); }